

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall FIX::Message::validate(Message *this)

{
  int iVar1;
  int iVar2;
  FieldBase *pFVar3;
  ostream *poVar4;
  InvalidMessage *pIVar5;
  string local_208 [3];
  stringstream text;
  ostream local_198 [376];
  
  pFVar3 = FieldMap::getFieldRef(&(this->m_header).super_FieldMap,9);
  iVar1 = IntField::getValue((IntField *)pFVar3);
  iVar2 = bodyLength(this,8,9,10);
  if (iVar1 != iVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&text);
    poVar4 = std::operator<<(local_198,"Expected BodyLength=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,", Received BodyLength=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    pIVar5 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::stringbuf::str();
    InvalidMessage::InvalidMessage(pIVar5,local_208);
    __cxa_throw(pIVar5,&InvalidMessage::typeinfo,Exception::~Exception);
  }
  pFVar3 = FieldMap::getFieldRef(&(this->m_trailer).super_FieldMap,10);
  iVar1 = CheckSumField::getValue((CheckSumField *)pFVar3);
  iVar2 = checkSum(this,10);
  if (iVar1 == iVar2) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&text);
  poVar4 = std::operator<<(local_198,"Expected CheckSum=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,", Received CheckSum=");
  std::ostream::operator<<(poVar4,iVar2);
  pIVar5 = (InvalidMessage *)__cxa_allocate_exception(0x50);
  std::__cxx11::stringbuf::str();
  InvalidMessage::InvalidMessage(pIVar5,local_208);
  __cxa_throw(pIVar5,&InvalidMessage::typeinfo,Exception::~Exception);
}

Assistant:

void Message::validate() const {
  try {
    const BodyLength &aBodyLength = FIELD_GET_REF(m_header, BodyLength);

    const size_t expectedLength = static_cast<size_t>(aBodyLength);
    const size_t receivedLength = bodyLength();

    if (expectedLength != receivedLength) {
      std::stringstream text;
      text << "Expected BodyLength=" << expectedLength << ", Received BodyLength=" << receivedLength;
      throw InvalidMessage(text.str());
    }

    const CheckSum &aCheckSum = FIELD_GET_REF(m_trailer, CheckSum);

    const int expectedChecksum = (int)aCheckSum;
    const int receivedChecksum = checkSum();

    if (expectedChecksum != receivedChecksum) {
      std::stringstream text;
      text << "Expected CheckSum=" << expectedChecksum << ", Received CheckSum=" << receivedChecksum;
      throw InvalidMessage(text.str());
    }
  } catch (FieldNotFound &e) {
    const std::string fieldName = (e.field == FIX::FIELD::BodyLength) ? "BodyLength" : "CheckSum";
    throw InvalidMessage(fieldName + std::string(" is missing"));
  } catch (IncorrectDataFormat &e) {
    const std::string fieldName = (e.field == FIX::FIELD::BodyLength) ? "BodyLength" : "CheckSum";
    throw InvalidMessage(fieldName + std::string(" has wrong format: ") + e.detail);
  }
}